

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_lshift_fixed_into(mp_int *r,mp_int *a,size_t bits)

{
  ulong uVar1;
  BignumInt BVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong local_38;
  size_t i;
  size_t bitoff;
  size_t words;
  size_t bits_local;
  mp_int *a_local;
  mp_int *r_local;
  
  uVar1 = bits >> 6;
  local_38 = r->nw;
  while (uVar4 = local_38 - 1, local_38 != 0) {
    local_38 = uVar4;
    if (uVar4 < uVar1) {
      r->w[uVar4] = 0;
    }
    else {
      BVar2 = mp_word(a,uVar4 - uVar1);
      r->w[uVar4] = BVar2;
      if ((bits & 0x3f) != 0) {
        sVar3 = (sbyte)(bits & 0x3f);
        r->w[uVar4] = r->w[uVar4] << sVar3;
        if (uVar1 < uVar4) {
          BVar2 = mp_word(a,(uVar4 - uVar1) - 1);
          r->w[uVar4] = BVar2 >> (0x40U - sVar3 & 0x3f) | r->w[uVar4];
        }
      }
    }
  }
  return;
}

Assistant:

void mp_lshift_fixed_into(mp_int *r, mp_int *a, size_t bits)
{
    size_t words = bits / BIGNUM_INT_BITS;
    size_t bitoff = bits % BIGNUM_INT_BITS;

    for (size_t i = r->nw; i-- > 0 ;) {
        if (i < words) {
            r->w[i] = 0;
        } else {
            r->w[i] = mp_word(a, i - words);
            if (bitoff != 0) {
                r->w[i] <<= bitoff;
                if (i > words)
                    r->w[i] |= mp_word(a, i - words - 1) >>
                        (BIGNUM_INT_BITS - bitoff);
            }
        }
    }
}